

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.cpp
# Opt level: O1

double duckdb::JaroScalarFunction(string_t *s1,string_t *s2,double_t *score_cutoff)

{
  ulong uVar1;
  char *T_first;
  ulong uVar2;
  char *P_first;
  double dVar3;
  
  uVar2 = (ulong)(s1->value).pointer.length;
  if (uVar2 < 0xd) {
    P_first = (s1->value).pointer.prefix;
  }
  else {
    P_first = (s1->value).pointer.ptr;
  }
  uVar1 = (ulong)(s2->value).pointer.length;
  if (uVar1 < 0xd) {
    T_first = (s2->value).pointer.prefix;
  }
  else {
    T_first = (s2->value).pointer.ptr;
  }
  dVar3 = duckdb_jaro_winkler::detail::jaro_similarity<char_const*,char_const*>
                    (P_first,P_first + uVar2,T_first,T_first + uVar1,*score_cutoff);
  return dVar3;
}

Assistant:

static inline double JaroScalarFunction(const string_t &s1, const string_t &s2, const double_t &score_cutoff = 0.0) {
	auto s1_begin = s1.GetData();
	auto s2_begin = s2.GetData();
	return duckdb_jaro_winkler::jaro_similarity(s1_begin, s1_begin + s1.GetSize(), s2_begin, s2_begin + s2.GetSize(),
	                                            score_cutoff);
}